

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O2

int64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getSmallIntUnchecked(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  unsigned_long uVar2;
  int64_t iVar3;
  long lVar4;
  
  bVar1 = **(byte **)this;
  if ((byte)(bVar1 - 0x30) < 10) {
    return (ulong)(bVar1 & 0xf);
  }
  if ((byte)(bVar1 - 0x3a) < 6) {
    return (long)(char)bVar1 | 0xffffffffffffffc0;
  }
  if (((int)(char)bVar1 & 0xf0U | 8) != 0x28) {
    return 0;
  }
  bVar1 = **(byte **)this;
  if ((bVar1 & 0xf8) == 0x20) {
    uVar2 = readIntegerNonEmpty<unsigned_long>(*(byte **)this + 1,(ulong)(bVar1 - 0x1f));
    if (bVar1 != 0x27) {
      lVar4 = 0;
      if (*(long *)(::(anonymous_namespace)::maxValues + (ulong)(bVar1 - 0x20) * 8) <= (long)uVar2)
      {
        lVar4 = *(long *)(::(anonymous_namespace)::maxValues + (ulong)(bVar1 - 0x20) * 8) * 2;
      }
      uVar2 = uVar2 - lVar4;
    }
    return uVar2;
  }
  iVar3 = getSmallIntUnchecked(this);
  return iVar3;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }